

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_common.c
# Opt level: O0

sljit_s32 sljit_emit_op_custom(sljit_compiler *compiler,void *instruction,sljit_s32 size)

{
  undefined1 *puVar1;
  sljit_u8 *inst;
  sljit_s32 size_local;
  void *instruction_local;
  sljit_compiler *compiler_local;
  
  if (compiler->error == 0) {
    puVar1 = (undefined1 *)ensure_buf(compiler,(long)(size + 1));
    if (puVar1 == (undefined1 *)0x0) {
      compiler_local._4_4_ = compiler->error;
    }
    else {
      *puVar1 = (char)size;
      compiler->size = (long)size + compiler->size;
      memcpy(puVar1 + 1,instruction,(long)size);
      compiler_local._4_4_ = 0;
    }
  }
  else {
    compiler_local._4_4_ = compiler->error;
  }
  return compiler_local._4_4_;
}

Assistant:

SLJIT_API_FUNC_ATTRIBUTE sljit_s32 sljit_emit_op_custom(struct sljit_compiler *compiler,
	void *instruction, sljit_s32 size)
{
	sljit_u8 *inst;

	CHECK_ERROR();
	CHECK(check_sljit_emit_op_custom(compiler, instruction, size));

	inst = (sljit_u8*)ensure_buf(compiler, 1 + size);
	FAIL_IF(!inst);
	INC_SIZE(size);
	SLJIT_MEMCPY(inst, instruction, size);
	return SLJIT_SUCCESS;
}